

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCraneRailFShapeProfileDef::~IfcCraneRailFShapeProfileDef
          (IfcCraneRailFShapeProfileDef *this)

{
  ~IfcCraneRailFShapeProfileDef
            ((IfcCraneRailFShapeProfileDef *)&this[-1].super_IfcParameterizedProfileDef.field_0x80);
  return;
}

Assistant:

IfcCraneRailFShapeProfileDef() : Object("IfcCraneRailFShapeProfileDef") {}